

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clique.cc
# Opt level: O1

SearchResult __thiscall
anon_unknown.dwarf_66f1e::CliqueRunner::expand<true>
          (CliqueRunner *this,int depth,unsigned_long_long *nodes,unsigned_long_long *find_nodes,
          unsigned_long_long *prove_nodes,vector<int,_std::allocator<int>_> *c,SVOBitset *p,
          conditional_t<true,_const_SVOBitset_&,_int> a,int spacepos)

{
  pointer *ppiVar1;
  pointer plVar2;
  size_t *psVar3;
  BitWord BVar4;
  iterator iVar5;
  CliqueParams *pCVar6;
  Proof *pPVar7;
  size_t sVar8;
  int *piVar9;
  pointer plVar10;
  byte bVar11;
  bool bVar12;
  int __tmp;
  int iVar13;
  SearchResult SVar14;
  void *pvVar15;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var16;
  undefined8 uVar17;
  _List_node_base *p_Var18;
  SVOBitset *pSVar19;
  int iVar20;
  conditional_t<true,_const_SVOBitset_&,_int> pSVar21;
  uint uVar22;
  long lVar23;
  _Self __tmp_1;
  pointer plVar24;
  undefined4 in_register_00000034;
  ulong uVar25;
  int *piVar26;
  int v_2;
  ulong uVar27;
  int v_1;
  int iVar28;
  uint local_1b8;
  SearchResult local_1b4;
  int local_1b0;
  int v;
  int *local_1a8;
  Incumbent *local_1a0;
  CliqueRunner *local_198;
  ulong local_190;
  int *local_188;
  undefined8 local_180;
  SVOBitset p_left;
  SVOBitset new_a;
  
  local_180 = CONCAT44(in_register_00000034,depth);
  *nodes = *nodes + 1;
  *prove_nodes = *prove_nodes + 1;
  local_1a8 = this->space + spacepos;
  local_188 = this->space + (this->size + spacepos);
  local_1b8 = 0;
  local_198 = this;
  if ((c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start ==
      (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish)
  {
    colour_class_order(this,p,local_1a8,local_188,(int *)&local_1b8);
  }
  else {
    local_1b8 = 0;
    gss::innards::SVOBitset::SVOBitset(&p_left,p);
    gss::innards::SVOBitset::intersect_with_complement(&p_left,a);
    bVar12 = gss::innards::SVOBitset::any(&p_left);
    iVar28 = 0;
    if (bVar12) {
      iVar28 = 0;
      uVar27 = (ulong)local_1b8;
      do {
        new_a.n_words = p_left.n_words;
        if ((ulong)p_left.n_words < 0x11) {
          new_a._data._8_8_ = p_left._data.short_data[1];
          new_a._data.short_data[0] = p_left._data.short_data[0];
          new_a._data.short_data[2] = p_left._data.short_data[2];
          new_a._data._24_40_ = p_left._data._24_40_;
          new_a._data.short_data[8] = p_left._data.short_data[8];
          new_a._data.short_data[9] = p_left._data.short_data[9];
          new_a._data.short_data[10] = p_left._data.short_data[10];
          new_a._data.short_data[0xb] = p_left._data.short_data[0xb];
          new_a._data.short_data[0xc] = p_left._data.short_data[0xc];
          new_a._data.short_data[0xd] = p_left._data.short_data[0xd];
          new_a._data.short_data[0xe] = p_left._data.short_data[0xe];
          new_a._data.short_data[0xf] = p_left._data.short_data[0xf];
        }
        else {
          uVar25 = (ulong)p_left.n_words << 3;
          pvVar15 = operator_new__(uVar25);
          new_a._data.long_data = (BitWord *)pvVar15;
          memmove(pvVar15,p_left._data.long_data,uVar25);
        }
        iVar28 = iVar28 + 1;
        bVar12 = gss::innards::SVOBitset::any(&new_a);
        if (bVar12) {
          uVar27 = (ulong)(int)uVar27;
          do {
            uVar22 = new_a.n_words;
            uVar25 = (ulong)new_a.n_words;
            uVar17 = &new_a;
            if (0x10 < uVar25) {
              uVar17 = new_a._data.short_data[0];
            }
            iVar13 = -1;
            if (uVar25 != 0) {
              lVar23 = 0;
LAB_00115a5d:
              BVar4 = (((SVOBitset *)uVar17)->_data).short_data[0];
              if (BVar4 == 0) goto code_r0x00115a65;
              iVar13 = 0;
              for (; (BVar4 & 1) == 0; BVar4 = BVar4 >> 1 | 0x8000000000000000) {
                iVar13 = iVar13 + 1;
              }
              iVar13 = iVar13 - (int)lVar23;
            }
LAB_00115a7f:
            uVar17 = &p_left;
            if (0x10 < p_left.n_words) {
              uVar17 = p_left._data.short_data[0];
            }
            bVar11 = (byte)iVar13 & 0x3f;
            uVar25 = -2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11;
            iVar20 = iVar13 + 0x3f;
            if (-1 < iVar13) {
              iVar20 = iVar13;
            }
            (((SVOBitset *)uVar17)->_data).short_data[iVar20 >> 6] =
                 (((SVOBitset *)uVar17)->_data).short_data[iVar20 >> 6] & uVar25;
            uVar17 = &new_a;
            if (0x10 < uVar22) {
              uVar17 = new_a._data.short_data[0];
            }
            (((SVOBitset *)uVar17)->_data).short_data[iVar20 >> 6] =
                 (((SVOBitset *)uVar17)->_data).short_data[iVar20 >> 6] & uVar25;
            gss::innards::SVOBitset::intersect_with_complement
                      (&new_a,(local_198->adj).
                              super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                              ._M_impl.super__Vector_impl_data._M_start + iVar13);
            local_188[uVar27] = iVar28;
            local_1a8[uVar27] = iVar13;
            uVar27 = uVar27 + 1;
            bVar12 = gss::innards::SVOBitset::any(&new_a);
          } while (bVar12);
        }
        if ((0x10 < new_a.n_words) && (new_a._data.short_data[0] != 0)) {
          operator_delete__(new_a._data.long_data);
        }
        bVar12 = gss::innards::SVOBitset::any(&p_left);
      } while (bVar12);
      local_1b8 = (uint)uVar27;
    }
    gss::innards::SVOBitset::operator=(&p_left,p);
    gss::innards::SVOBitset::operator&=(&p_left,a);
    bVar12 = gss::innards::SVOBitset::any(&p_left);
    if (bVar12) {
      uVar27 = (ulong)local_1b8;
      do {
        new_a.n_words = p_left.n_words;
        if ((ulong)p_left.n_words < 0x11) {
          new_a._data._8_8_ = p_left._data.short_data[1];
          new_a._data.short_data[0] = p_left._data.short_data[0];
          new_a._data.short_data[2] = p_left._data.short_data[2];
          new_a._data._24_40_ = p_left._data._24_40_;
          new_a._data.short_data[8] = p_left._data.short_data[8];
          new_a._data.short_data[9] = p_left._data.short_data[9];
          new_a._data.short_data[10] = p_left._data.short_data[10];
          new_a._data.short_data[0xb] = p_left._data.short_data[0xb];
          new_a._data.short_data[0xc] = p_left._data.short_data[0xc];
          new_a._data.short_data[0xd] = p_left._data.short_data[0xd];
          new_a._data.short_data[0xe] = p_left._data.short_data[0xe];
          new_a._data.short_data[0xf] = p_left._data.short_data[0xf];
        }
        else {
          uVar25 = (ulong)p_left.n_words << 3;
          pvVar15 = operator_new__(uVar25);
          new_a._data.long_data = (BitWord *)pvVar15;
          memmove(pvVar15,p_left._data.long_data,uVar25);
        }
        iVar28 = iVar28 + 1;
        bVar12 = gss::innards::SVOBitset::any(&new_a);
        if (bVar12) {
          uVar27 = (ulong)(int)uVar27;
          do {
            uVar22 = new_a.n_words;
            uVar25 = (ulong)new_a.n_words;
            uVar17 = &new_a;
            if (0x10 < uVar25) {
              uVar17 = new_a._data.short_data[0];
            }
            iVar13 = -1;
            if (uVar25 != 0) {
              lVar23 = 0;
LAB_00115c26:
              BVar4 = (((SVOBitset *)uVar17)->_data).short_data[0];
              if (BVar4 == 0) goto code_r0x00115c2e;
              iVar13 = 0;
              for (; (BVar4 & 1) == 0; BVar4 = BVar4 >> 1 | 0x8000000000000000) {
                iVar13 = iVar13 + 1;
              }
              iVar13 = iVar13 - (int)lVar23;
            }
LAB_00115c48:
            uVar17 = &p_left;
            if (0x10 < p_left.n_words) {
              uVar17 = p_left._data.short_data[0];
            }
            bVar11 = (byte)iVar13 & 0x3f;
            uVar25 = -2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11;
            iVar20 = iVar13 + 0x3f;
            if (-1 < iVar13) {
              iVar20 = iVar13;
            }
            (((SVOBitset *)uVar17)->_data).short_data[iVar20 >> 6] =
                 (((SVOBitset *)uVar17)->_data).short_data[iVar20 >> 6] & uVar25;
            uVar17 = &new_a;
            if (0x10 < uVar22) {
              uVar17 = new_a._data.short_data[0];
            }
            (((SVOBitset *)uVar17)->_data).short_data[iVar20 >> 6] =
                 (((SVOBitset *)uVar17)->_data).short_data[iVar20 >> 6] & uVar25;
            gss::innards::SVOBitset::intersect_with_complement
                      (&new_a,(local_198->adj).
                              super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                              ._M_impl.super__Vector_impl_data._M_start + iVar13);
            local_188[uVar27] = iVar28;
            local_1a8[uVar27] = iVar13;
            uVar27 = uVar27 + 1;
            bVar12 = gss::innards::SVOBitset::any(&new_a);
          } while (bVar12);
        }
        if ((0x10 < new_a.n_words) && (new_a._data.short_data[0] != 0)) {
          operator_delete__(new_a._data.long_data);
        }
        bVar12 = gss::innards::SVOBitset::any(&p_left);
      } while (bVar12);
      local_1b8 = (uint)uVar27;
    }
    this = local_198;
    if ((0x10 < p_left.n_words) && (p_left._data.short_data[0] != 0)) {
      operator_delete__(p_left._data.long_data);
      this = local_198;
    }
  }
  uVar27 = (ulong)local_1b8;
  local_1a0 = &this->incumbent;
  local_1b0 = (int)local_180 + 1;
  while( true ) {
    if ((int)uVar27 < 1) {
      iVar28 = 2;
      goto LAB_001163be;
    }
    bVar12 = gss::Timeout::should_abort
                       ((this->params->timeout).
                        super___shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (bVar12) break;
    piVar26 = (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_start;
    iVar5._M_current =
         (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    local_190 = uVar27;
    if ((ulong)((long)local_188[uVar27 - 1] + ((long)iVar5._M_current - (long)piVar26 >> 2)) <=
        (ulong)local_1a0->value) {
      bVar12 = true;
      if ((this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (element_type *)0x0) {
        p_left._data.short_data[0] = 0;
        p_left._data.short_data[1] = 0;
        p_left._data.short_data[2] = 0;
        uVar27 = 0;
        do {
          if ((uVar27 == 0) || (local_188[uVar27 - 1] != local_188[uVar27])) {
            if (p_left._data.short_data[1] == p_left._data.short_data[2]) {
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::_M_realloc_insert<>
                        ((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          *)&p_left,(iterator)p_left._data.short_data[1]);
            }
            else {
              *(undefined8 *)p_left._data.short_data[1] = 0;
              *(undefined8 *)(p_left._data.short_data[1] + 8) = 0;
              *(undefined8 *)(p_left._data.short_data[1] + 0x10) = 0;
              p_left._data.short_data[1] = p_left._data.short_data[1] + 0x18;
            }
          }
          piVar26 = (this->order).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start + local_1a8[uVar27];
          iVar5._M_current = *(int **)(p_left._data.short_data[1] - 0x10);
          if (iVar5._M_current == *(int **)(p_left._data.short_data[1] - 8)) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)(p_left._data.short_data[1] - 0x18),iVar5,
                       piVar26);
          }
          else {
            *iVar5._M_current = *piVar26;
            *(int **)(p_left._data.short_data[1] - 0x10) = iVar5._M_current + 1;
          }
          uVar27 = uVar27 + 1;
        } while (local_190 != uVar27);
        gss::innards::Proof::colour_bound
                  ((this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,(vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            *)&p_left);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)&p_left);
      }
      goto LAB_001163ca;
    }
    v = local_1a8[uVar27 - 1];
    if (piVar26 == iVar5._M_current) {
LAB_00115de4:
      if (iVar5._M_current ==
          (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)c,iVar5,&v);
      }
      else {
        *iVar5._M_current = v;
        (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
             = iVar5._M_current + 1;
      }
      pCVar6 = this->params;
      if ((pCVar6->decide).super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_engaged == false) {
        if ((pCVar6->stop_after_finding).super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_engaged == true) goto LAB_00115e2a;
        pPVar7 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if (((pPVar7 != (Proof *)0x0) &&
            ((ulong)local_1a0->value <
             (ulong)((long)(c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start >> 2))) &&
           (pCVar6->proof_is_for_hom == false)) {
          gss::innards::Proof::start_level(pPVar7,0);
          pPVar7 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          unpermute_and_finish
                    ((vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)&p_left
                     ,this,c);
          gss::innards::Proof::new_incumbent
                    (pPVar7,(vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)
                            &p_left);
          if (p_left._data.short_data[0] != 0) {
            operator_delete(p_left._data.long_data,p_left._data.short_data[2] - p_left._data._0_8_);
          }
          gss::innards::Proof::start_level
                    ((this->proof).
                     super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     local_1b0);
        }
        Incumbent::update(local_1a0,c,find_nodes,prove_nodes);
LAB_0011601a:
        gss::innards::SVOBitset::SVOBitset(&p_left,p);
        gss::innards::SVOBitset::operator&=
                  (&p_left,(this->adj).
                           super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                           ._M_impl.super__Vector_impl_data._M_start + v);
        iVar13 = (*((this->params->restarts_schedule)._M_t.
                    super___uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_gss::RestartsSchedule_*,_std::default_delete<gss::RestartsSchedule>_>
                    .super__Head_base<0UL,_gss::RestartsSchedule_*,_false>._M_head_impl)->
                   _vptr_RestartsSchedule[5])();
        iVar28 = v;
        if ((char)iVar13 != '\0') {
          plVar2 = (this->watches).table.data.
                   super__Vector_base<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>,_std::allocator<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + v;
          plVar24 = *(pointer *)
                     &(plVar2->
                      super__List_base<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>
                      )._M_impl;
LAB_00116080:
          if (plVar24 != plVar2) {
            sVar8 = (plVar24->
                    super__List_base<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>
                    )._M_impl._M_node._M_size;
            piVar26 = *(int **)(sVar8 + 0x10);
            iVar13 = *piVar26;
            if (iVar13 != iVar28) {
              *piVar26 = piVar26[1];
              piVar26[1] = iVar13;
            }
            for (piVar26 = piVar26 + 2; piVar26 != *(int **)(sVar8 + 0x18); piVar26 = piVar26 + 1) {
              new_a._data.short_data[0]._0_4_ = *piVar26;
              piVar9 = (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
              _Var16 = std::
                       __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                                 ((c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_start,piVar9,&new_a);
              this = local_198;
              if (piVar9 == _Var16._M_current) {
                piVar9 = *(int **)(sVar8 + 0x10);
                iVar13 = *piVar9;
                *piVar9 = *piVar26;
                *piVar26 = iVar13;
                iVar13 = *piVar9;
                plVar10 = (local_198->watches).table.data.
                          super__Vector_base<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>,_std::allocator<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                p_Var18 = (_List_node_base *)operator_new(0x18);
                p_Var18[1]._M_next =
                     (_List_node_base *)
                     (plVar24->
                     super__List_base<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>
                     )._M_impl._M_node._M_size;
                std::__detail::_List_node_base::_M_hook(p_Var18);
                psVar3 = &plVar10[iVar13].
                          super__List_base<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>
                          ._M_impl._M_node._M_size;
                *psVar3 = *psVar3 + 1;
                plVar10 = *(pointer *)
                           &(plVar24->
                            super__List_base<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>
                            )._M_impl;
                psVar3 = &(plVar2->
                          super__List_base<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>
                          )._M_impl._M_node._M_size;
                *psVar3 = *psVar3 - 1;
                std::__detail::_List_node_base::_M_unhook();
                operator_delete(plVar24,0x18);
                plVar24 = plVar10;
                goto LAB_00116080;
              }
            }
            uVar17 = &p_left;
            if (0x10 < p_left.n_words) {
              uVar17 = p_left._data.short_data[0];
            }
            iVar13 = *(int *)(*(long *)(sVar8 + 0x10) + 4);
            bVar11 = (byte)iVar13 & 0x3f;
            iVar20 = iVar13 + 0x3f;
            if (-1 < iVar13) {
              iVar20 = iVar13;
            }
            (((SVOBitset *)uVar17)->_data).short_data[iVar20 >> 6] =
                 (((SVOBitset *)uVar17)->_data).short_data[iVar20 >> 6] &
                 (-2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11);
            plVar24 = *(pointer *)
                       &(plVar24->
                        super__List_base<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>
                        )._M_impl;
            this = local_198;
            goto LAB_00116080;
          }
        }
        uVar27 = local_190;
        pPVar7 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if (pPVar7 != (Proof *)0x0) {
          gss::innards::Proof::start_level(pPVar7,local_1b0);
        }
        bVar12 = gss::innards::SVOBitset::any(&p_left);
        SVar14 = local_1b4;
        if (bVar12) {
          gss::innards::SVOBitset::SVOBitset(&new_a,a);
          gss::innards::SVOBitset::operator|=
                    (&new_a,(this->connected_table).
                            super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                            ._M_impl.super__Vector_impl_data._M_start + v);
          SVar14 = expand<true>(this,local_1b0,nodes,find_nodes,prove_nodes,c,&p_left,&new_a,
                                spacepos + this->size * 2);
          bVar12 = false;
          if (SVar14 != Aborted) {
            if (SVar14 == Restart) {
              ppiVar1 = &(c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppiVar1 = *ppiVar1 + -1;
              uVar25 = (ulong)local_1b8;
              SVar14 = Restart;
              while ((int)uVar27 < (int)uVar25) {
                uVar25 = (ulong)((int)uVar25 - 1);
                iVar5._M_current =
                     (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar5._M_current ==
                    (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)c,iVar5,local_1a8 + uVar25);
                }
                else {
                  *iVar5._M_current = local_1a8[uVar25];
                  (c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
                  ._M_finish = iVar5._M_current + 1;
                }
                post_nogood(this,c);
                ppiVar1 = &(c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_finish;
                *ppiVar1 = *ppiVar1 + -1;
              }
              bVar12 = false;
            }
            else if (SVar14 != DecidedTrue) {
              bVar12 = true;
              SVar14 = local_1b4;
            }
          }
          if ((0x10 < new_a.n_words) && (new_a._data.short_data[0] != 0)) {
            operator_delete__(new_a._data.long_data);
          }
          iVar28 = 1;
          if (bVar12) goto LAB_001162d9;
        }
        else {
LAB_001162d9:
          pPVar7 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          if (pPVar7 != (Proof *)0x0) {
            gss::innards::Proof::start_level(pPVar7,(int)local_180);
            pPVar7 = (this->proof).
                     super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            unpermute((vector<int,_std::allocator<int>_> *)&new_a,this,c);
            gss::innards::Proof::backtrack_from_binary_variables
                      (pPVar7,(vector<int,_std::allocator<int>_> *)&new_a);
            if (new_a._data.short_data[0] != 0) {
              operator_delete(new_a._data.long_data,new_a._data.short_data[2] - new_a._data._0_8_);
            }
            gss::innards::Proof::forget_level
                      ((this->proof).
                       super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       local_1b0);
          }
          ppiVar1 = &(c->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppiVar1 = *ppiVar1 + -1;
          pSVar19 = p;
          if (0x10 < p->n_words) {
            pSVar19 = (SVOBitset *)(p->_data).short_data[0];
          }
          bVar11 = (byte)v & 0x3f;
          iVar28 = v + 0x3f;
          if (-1 < v) {
            iVar28 = v;
          }
          (pSVar19->_data).short_data[iVar28 >> 6] =
               (pSVar19->_data).short_data[iVar28 >> 6] &
               (-2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11);
          iVar28 = 0;
        }
        if ((0x10 < p_left.n_words) && (p_left._data.short_data[0] != 0)) {
          operator_delete__(p_left._data.long_data);
        }
      }
      else {
        if (local_1a0->value <
            (pCVar6->decide).super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_payload._M_value) {
LAB_00115e2a:
          if (((pCVar6->stop_after_finding).super__Optional_base<unsigned_int,_true,_true>.
               _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged != true) ||
             (local_1a0->value <
              (pCVar6->stop_after_finding).super__Optional_base<unsigned_int,_true,_true>._M_payload
              .super__Optional_payload_base<unsigned_int>._M_payload._M_value)) goto LAB_0011601a;
        }
        pPVar7 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        iVar28 = 1;
        SVar14 = DecidedTrue;
        if (pPVar7 != (Proof *)0x0) {
          unpermute((vector<int,_std::allocator<int>_> *)&p_left,this,c);
          gss::innards::Proof::post_solution(pPVar7,(vector<int,_std::allocator<int>_> *)&p_left);
          if (p_left._data.short_data[0] != 0) {
            operator_delete(p_left._data.long_data,p_left._data.short_data[2] - p_left._data._0_8_);
          }
        }
      }
    }
    else {
      pSVar21 = a;
      if (0x10 < a->n_words) {
        pSVar21 = (conditional_t<true,_const_SVOBitset_&,_int>)(a->_data).short_data[0];
      }
      uVar22 = v + 0x3f;
      if (-1 < v) {
        uVar22 = v;
      }
      if (((pSVar21->_data).short_data[(int)uVar22 >> 6] >> ((ulong)(uint)v & 0x3f) & 1) != 0)
      goto LAB_00115de4;
      iVar28 = 2;
      SVar14 = local_1b4;
      if ((this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (element_type *)0x0) {
        unpermute((vector<int,_std::allocator<int>_> *)&p_left,this,c);
        uVar27 = 0;
        do {
          pPVar7 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          unpermute((vector<int,_std::allocator<int>_> *)&new_a,this,c);
          gss::innards::Proof::not_connected_in_underlying_graph
                    (pPVar7,(vector<int,_std::allocator<int>_> *)&new_a,
                     (this->order).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[local_1a8[uVar27]]);
          if (new_a._data.short_data[0] != 0) {
            operator_delete(new_a._data.long_data,new_a._data.short_data[2] - new_a._data._0_8_);
          }
          uVar27 = uVar27 + 1;
        } while (local_190 != uVar27);
        gss::innards::Proof::start_level
                  ((this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,(int)local_180);
        pPVar7 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        unpermute((vector<int,_std::allocator<int>_> *)&new_a,this,c);
        gss::innards::Proof::backtrack_from_binary_variables
                  (pPVar7,(vector<int,_std::allocator<int>_> *)&new_a);
        if (new_a._data.short_data[0] != 0) {
          operator_delete(new_a._data.long_data,new_a._data.short_data[2] - new_a._data._0_8_);
        }
        gss::innards::Proof::forget_level
                  ((this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,local_1b0);
        SVar14 = local_1b4;
        if (p_left._data.short_data[0] != 0) {
          operator_delete(p_left._data.long_data,p_left._data.short_data[2] - p_left._data._0_8_);
          SVar14 = local_1b4;
        }
      }
    }
    local_1b4 = SVar14;
    uVar27 = local_190 - 1;
    if (iVar28 != 0) {
LAB_001163be:
      bVar12 = iVar28 == 2;
LAB_001163ca:
      if (bVar12) {
        (*((this->params->restarts_schedule)._M_t.
           super___uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::RestartsSchedule_*,_std::default_delete<gss::RestartsSchedule>_>
           .super__Head_base<0UL,_gss::RestartsSchedule_*,_false>._M_head_impl)->
          _vptr_RestartsSchedule[2])();
        iVar28 = (*((this->params->restarts_schedule)._M_t.
                    super___uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_gss::RestartsSchedule_*,_std::default_delete<gss::RestartsSchedule>_>
                    .super__Head_base<0UL,_gss::RestartsSchedule_*,_false>._M_head_impl)->
                   _vptr_RestartsSchedule[4])();
        local_1b4 = Complete;
        if ((char)iVar28 != '\0') {
          post_nogood(this,c);
          local_1b4 = Restart;
        }
      }
      return local_1b4;
    }
  }
  iVar28 = 1;
  local_1b4 = Aborted;
  goto LAB_001163be;
code_r0x00115a65:
  lVar23 = lVar23 + -0x40;
  uVar17 = (long)&((SVOBitset *)uVar17)->_data + 8;
  if (uVar25 * 0x40 + lVar23 == 0) goto LAB_00115a7f;
  goto LAB_00115a5d;
code_r0x00115c2e:
  lVar23 = lVar23 + -0x40;
  uVar17 = (long)&((SVOBitset *)uVar17)->_data + 8;
  if (uVar25 * 0x40 + lVar23 == 0) goto LAB_00115c48;
  goto LAB_00115c26;
}

Assistant:

auto expand(
            int depth,
            unsigned long long & nodes,
            unsigned long long & find_nodes,
            unsigned long long & prove_nodes,
            vector<int> & c,
            SVOBitset & p,
            conditional_t<connected_, const SVOBitset &, int> a,
            int spacepos) -> SearchResult
        {
            ++nodes;
            ++prove_nodes;

            // initial colouring
            int * p_order = &space[spacepos];
            int * p_bounds = &space[spacepos + size];

            int p_end = 0;

            if constexpr (connected_) {
                if (! c.empty())
                    connected_colour_class_order(p, a, p_order, p_bounds, p_end);
                else
                    colour_class_order(p, p_order, p_bounds, p_end);
            }
            else {
                switch (params.colour_class_order) {
                case ColourClassOrder::ColourOrder: colour_class_order(p, p_order, p_bounds, p_end); break;
                case ColourClassOrder::SingletonsFirst: colour_class_order_2df(p, p_order, p_bounds, &space[spacepos + 2 * size], p_end); break;
                case ColourClassOrder::Sorted: colour_class_order_sorted(p, p_order, p_bounds, p_end); break;
                }
            }

            // for each v in p... (v comes later)
            for (int n = p_end - 1; n >= 0; --n) {
                // bound, timeout or early exit?
                if (params.timeout->should_abort())
                    return SearchResult::Aborted;

                if (c.size() + p_bounds[n] <= incumbent.value) {
                    if (proof) {
                        vector<vector<int>> colour_classes;
                        for (int v = 0; v <= n; ++v) {
                            if (0 == v || p_bounds[v - 1] != p_bounds[v])
                                colour_classes.emplace_back();
                            colour_classes.back().push_back(order[p_order[v]]);
                        }
                        proof->colour_bound(colour_classes);
                    }
                    break;
                }

                // if we've used k colours to colour k vertices, it's a clique. this isn't (I think?) a
                // valid shortcut in the connected case.
                if constexpr (! connected_) {
                    if (p_bounds[n] == n + 1) {
                        auto c_save = c;
                        for (; n >= 0; --n)
                            c.push_back(p_order[n]);
                        incumbent.update(c, find_nodes, prove_nodes);

                        if (proof && ! params.decide) {
                            proof->start_level(0);
                            proof->new_incumbent(unpermute_and_finish(c));
                            proof->start_level(depth + 1);
                        }

                        if ((params.decide && incumbent.value >= *params.decide) ||
                            (params.stop_after_finding && incumbent.value >= *params.stop_after_finding)) {
                            if (proof)
                                proof->post_solution(unpermute(c));

                            return SearchResult::DecidedTrue;
                        }

                        c = move(c_save);

                        break;
                    }
                }

                auto v = p_order[n];

                if constexpr (connected_) {
                    if ((! c.empty()) && (! a.test(v))) {
                        // none of the remaining vertices can give a connected underlying graph
                        if (proof) {
                            auto c_unpermuted = unpermute(c);
                            for (int v = 0; v <= n; ++v)
                                proof->not_connected_in_underlying_graph(unpermute(c), order[p_order[v]]);

                            proof->start_level(depth);
                            proof->backtrack_from_binary_variables(unpermute(c));
                            proof->forget_level(depth + 1);
                        }

                        break;
                    }
                }

                // consider taking v
                c.push_back(v);

                if (params.decide || params.stop_after_finding) {
                    if ((params.decide && incumbent.value >= *params.decide) ||
                        (params.stop_after_finding && incumbent.value >= *params.stop_after_finding)) {
                        if (proof)
                            proof->post_solution(unpermute(c));

                        return SearchResult::DecidedTrue;
                    }
                }
                else {
                    if (proof && c.size() > incumbent.value && ! params.proof_is_for_hom) {
                        proof->start_level(0);
                        proof->new_incumbent(unpermute_and_finish(c));
                        proof->start_level(depth + 1);
                    }
                    incumbent.update(c, find_nodes, prove_nodes);
                }

                // filter p to contain vertices adjacent to v
                SVOBitset new_p = p;
                new_p &= adj[v];

                if (params.restarts_schedule->might_restart())
                    watches.propagate(
                        v,
                        [&](int literal) { return c.end() == find(c.begin(), c.end(), literal); },
                        [&](int literal) { new_p.reset(literal); });

                if (proof)
                    proof->start_level(depth + 1);

                if (new_p.any()) {
                    auto new_a = a;

                    if constexpr (connected_) {
                        new_a |= connected_table[v];
                    }

                    switch (expand<connected_>(depth + 1, nodes, find_nodes, prove_nodes, c, new_p, new_a, spacepos + 2 * size)) {
                    case SearchResult::Aborted:
                        return SearchResult::Aborted;

                    case SearchResult::DecidedTrue:
                        return SearchResult::DecidedTrue;

                    case SearchResult::Complete:
                        break;

                    case SearchResult::Restart:
                        // restore assignments before posting nogoods, it's easier
                        c.pop_back();

                        // post nogoods for everything we've done so far
                        for (int m = p_end - 1; m > n; --m) {
                            c.push_back(p_order[m]);
                            post_nogood(c);
                            c.pop_back();
                        }

                        return SearchResult::Restart;
                    }
                }

                if (proof) {
                    proof->start_level(depth);
                    proof->backtrack_from_binary_variables(unpermute(c));
                    proof->forget_level(depth + 1);
                }

                // now consider not taking v
                c.pop_back();
                p.reset(v);
            }

            params.restarts_schedule->did_a_backtrack();
            if (params.restarts_schedule->should_restart()) {
                post_nogood(c);
                return SearchResult::Restart;
            }
            else
                return SearchResult::Complete;
        }